

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeFont(ImFont *font)

{
  ImVec2 IVar1;
  ushort uVar2;
  ImFontConfig *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImVec2 pos;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImU32 col;
  ImGuiIO *pIVar8;
  ImGuiStyle *pIVar9;
  ImFontGlyph *pIVar10;
  ImU32 col_00;
  int iVar11;
  ImWchar c;
  char *pcVar12;
  uint n;
  int iVar13;
  uint uVar14;
  long lVar15;
  int config_i;
  ulong uVar16;
  uint base;
  uint c_begin;
  void *ptr_id;
  float fVar17;
  float fVar18;
  ImVec2 cell_p1;
  ImVec2 cell_p2;
  char c_str [5];
  float local_48;
  
  pcVar12 = "";
  if (font->ConfigData != (ImFontConfig *)0x0) {
    pcVar12 = font->ConfigData->Name;
  }
  bVar6 = TreeNode(font,"Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                   SUB84((double)font->FontSize,0),pcVar12,(ulong)(uint)(font->Glyphs).Size,
                   (ulong)(uint)(int)font->ConfigDataCount);
  SameLine(0.0,-1.0);
  bVar7 = SmallButton("Set as default");
  if (bVar7) {
    pIVar8 = GetIO();
    pIVar8->FontDefault = font;
  }
  if (bVar6) {
    PushFont((ImFont *)0x144f65);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();
    pIVar5 = GImGui;
    fVar17 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar5->NextItemData).Width = fVar17 * 8.0;
    DragFloat("Font scale",&font->Scale,0.005,0.3,2.0,"%.1f",0);
    SameLine(0.0,-1.0);
    MetricsHelpMarker(
                     "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)"
                     );
    Text("Ascent: %f, Descent: %f, Height: %f",SUB84((double)font->Ascent,0),(double)font->Descent,
         (double)(font->Ascent - font->Descent));
    uVar2 = font->FallbackChar;
    ImTextCharToUtf8(c_str,(uint)uVar2);
    Text("Fallback character: \'%s\' (U+%04X)",c_str,(ulong)(uint)uVar2);
    uVar2 = font->EllipsisChar;
    ImTextCharToUtf8(c_str,(uint)uVar2);
    Text("Ellipsis character: \'%s\' (U+%04X)",c_str,(ulong)(uint)uVar2);
    fVar17 = (float)font->MetricsTotalSurface;
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)font->MetricsTotalSurface,
         (ulong)(uint)(int)fVar17);
    lVar15 = 0x56;
    for (uVar16 = 0; (long)uVar16 < (long)font->ConfigDataCount; uVar16 = uVar16 + 1) {
      pIVar3 = font->ConfigData;
      if (pIVar3 != (ImFontConfig *)0x0) {
        BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                   SUB84((double)*(float *)(pIVar3->Name + lVar15 + -0x80),0),
                   (double)*(float *)(pIVar3->Name + lVar15 + -0x7c),uVar16 & 0xffffffff,
                   pIVar3->Name + lVar15 + -0x56,(ulong)*(uint *)((long)pIVar3 + lVar15 + -0x3e),
                   (ulong)*(uint *)((long)pIVar3 + lVar15 + -0x3a),
                   (ulong)*(byte *)((long)pIVar3 + lVar15 + -0x36));
      }
      lVar15 = lVar15 + 0x88;
    }
    bVar6 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(font->Glyphs).Size);
    if (bVar6) {
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      this = pIVar4->DrawList;
      col = GetColorU32(0,1.0);
      fVar17 = font->FontSize;
      pIVar9 = GetStyle();
      fVar18 = (pIVar9->ItemSpacing).y + fVar17;
      ptr_id = (void *)0x0;
      while (c_begin = (uint)ptr_id, c_begin < 0x10000) {
        if (((ulong)ptr_id & 0xfff) == 0) {
          bVar6 = ImFont::IsGlyphRangeUnused(font,c_begin,c_begin | 0xfff);
          if (!bVar6) goto LAB_001451a4;
          c_begin = c_begin | 0xf00;
        }
        else {
LAB_001451a4:
          uVar16 = 0;
          iVar13 = 0;
          while( true ) {
            iVar11 = (int)uVar16;
            if (iVar13 == 0x100) break;
            pIVar10 = ImFont::FindGlyphNoFallback(font,(short)ptr_id + (short)iVar13);
            uVar16 = (ulong)((iVar11 + 1) - (uint)(pIVar10 == (ImFontGlyph *)0x0));
            iVar13 = iVar13 + 1;
          }
          if (iVar11 != 0) {
            pcVar12 = "glyphs";
            if (iVar11 == 1) {
              pcVar12 = "glyph";
            }
            bVar6 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",ptr_id,(ulong)(c_begin + 0xff),uVar16,
                             pcVar12);
            if (bVar6) {
              IVar1 = (GImGui->CurrentWindow->DC).CursorPos;
              uVar16 = 0;
              while (uVar14 = (uint)uVar16, uVar14 != 0x100) {
                local_48 = IVar1.x;
                cell_p1.x = (float)(uVar14 & 0xf) * fVar18 + local_48;
                cell_p1.y = (float)(int)(uVar16 >> 4) * fVar18 + IVar1.y;
                cell_p2.x = cell_p1.x + fVar17;
                cell_p2.y = cell_p1.y + fVar17;
                c = (ImWchar)(c_begin + uVar14);
                pIVar10 = ImFont::FindGlyphNoFallback(font,c);
                col_00 = 0x64ffffff;
                if (pIVar10 == (ImFontGlyph *)0x0) {
                  col_00 = 0x32ffffff;
                }
                ImDrawList::AddRect(this,&cell_p1,&cell_p2,col_00,0.0,0,1.0);
                if (pIVar10 != (ImFontGlyph *)0x0) {
                  pos.y = cell_p1.y;
                  pos.x = cell_p1.x;
                  ImFont::RenderChar(font,this,fVar17,pos,col,c);
                  bVar6 = IsMouseHoveringRect(&cell_p1,&cell_p2,true);
                  if (bVar6) {
                    BeginTooltip();
                    Text("Codepoint: U+%04X",(ulong)(c_begin + uVar14));
                    Separator();
                    Text("Visible: %d",(ulong)(*(uint *)pIVar10 >> 1 & 1));
                    Text("AdvanceX: %.1f",SUB84((double)pIVar10->AdvanceX,0));
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",SUB84((double)pIVar10->X0,0),
                         (double)pIVar10->Y0,(double)pIVar10->X1,(double)pIVar10->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",SUB84((double)pIVar10->U0,0),
                         (double)pIVar10->V0,(double)pIVar10->U1,(double)pIVar10->V1);
                    EndTooltip();
                  }
                }
                uVar16 = (ulong)(uVar14 + 1);
              }
              cell_p1.x = fVar18 * 16.0;
              cell_p1.y = fVar18 * 16.0;
              Dummy(&cell_p1);
              TreePop();
            }
          }
        }
        ptr_id = (void *)(ulong)(c_begin + 0x100);
      }
      TreePop();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeFont(ImFont* font)
{
    bool opened = TreeNode(font, "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
        font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
    SameLine();
    if (SmallButton("Set as default"))
        GetIO().FontDefault = font;
    if (!opened)
        return;

    // Display preview text
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();

    // Display details
    SetNextItemWidth(GetFontSize() * 8);
    DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");
    SameLine(); MetricsHelpMarker(
        "Note than the default embedded font is NOT meant to be scaled.\n\n"
        "Font are currently rendered into bitmaps at a given size at the time of building the atlas. "
        "You may oversample them to get some flexibility with scaling. "
        "You can also render at multiple sizes and select which one to use at runtime.\n\n"
        "(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)");
    Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
    char c_str[5];
    Text("Fallback character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->FallbackChar), font->FallbackChar);
    Text("Ellipsis character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->EllipsisChar), font->EllipsisChar);
    const int surface_sqrt = (int)ImSqrt((float)font->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, surface_sqrt, surface_sqrt);
    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
        if (font->ConfigData)
            if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                    config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH, cfg->GlyphOffset.x, cfg->GlyphOffset.y);

    // Display all glyphs of the fonts in separate pages of 256 characters
    if (TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
    {
        ImDrawList* draw_list = GetWindowDrawList();
        const ImU32 glyph_col = GetColorU32(ImGuiCol_Text);
        const float cell_size = font->FontSize * 1;
        const float cell_spacing = GetStyle().ItemSpacing.y;
        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
        {
            // Skip ahead if a large bunch of glyphs are not present in the font (test in chunks of 4k)
            // This is only a small optimization to reduce the number of iterations when IM_UNICODE_MAX_CODEPOINT
            // is large // (if ImWchar==ImWchar32 we will do at least about 272 queries here)
            if (!(base & 4095) && font->IsGlyphRangeUnused(base, base + 4095))
            {
                base += 4096 - 256;
                continue;
            }

            int count = 0;
            for (unsigned int n = 0; n < 256; n++)
                if (font->FindGlyphNoFallback((ImWchar)(base + n)))
                    count++;
            if (count <= 0)
                continue;
            if (!TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                continue;

            // Draw a 16x16 grid of glyphs
            ImVec2 base_pos = GetCursorScreenPos();
            for (unsigned int n = 0; n < 256; n++)
            {
                // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions
                // available here and thus cannot easily generate a zero-terminated UTF-8 encoded string.
                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                if (glyph)
                    font->RenderChar(draw_list, cell_size, cell_p1, glyph_col, (ImWchar)(base + n));
                if (glyph && IsMouseHoveringRect(cell_p1, cell_p2))
                {
                    BeginTooltip();
                    Text("Codepoint: U+%04X", base + n);
                    Separator();
                    Text("Visible: %d", glyph->Visible);
                    Text("AdvanceX: %.1f", glyph->AdvanceX);
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                    EndTooltip();
                }
            }
            Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
            TreePop();
        }
        TreePop();
    }
    TreePop();
}